

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon.c
# Opt level: O2

int mcalcmove(monst *mon)

{
  uint uVar1;
  int iVar2;
  
  iVar2 = (int)mon->data->mmove;
  uVar1 = *(uint *)&mon->field_0x60 >> 10 & 3;
  if (uVar1 == 2) {
    iVar2 = iVar2 * 4 + 2;
  }
  else {
    if (uVar1 != 1) goto LAB_001d9f2c;
    iVar2 = iVar2 * 2 + 1;
  }
  iVar2 = iVar2 / 3;
LAB_001d9f2c:
  if (((u.usteed == mon) && (u.ugallop != 0)) && (flags.mv != '\0')) {
    uVar1 = mt_random();
    iVar2 = (int)((uVar1 & 1 ^ 5) * iVar2) / 3;
  }
  return iVar2;
}

Assistant:

int mcalcmove(struct monst *mon)
{
    int mmove = mon->data->mmove;

    /* Note: MSLOW's `+ 1' prevents slowed speed 1 getting reduced to 0;
     *	     MFAST's `+ 2' prevents hasted speed 1 from becoming a no-op;
     *	     both adjustments have negligible effect on higher speeds.
     */
    if (mon->mspeed == MSLOW)
	mmove = (2 * mmove + 1) / 3;
    else if (mon->mspeed == MFAST)
	mmove = (4 * mmove + 2) / 3;

    if (mon == u.usteed) {
	if (u.ugallop && flags.mv) {
	    /* average movement is 1.50 times normal */
	    mmove = ((rn2(2) ? 4 : 5) * mmove) / 3;
	}
    }

    return mmove;
}